

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointer(Instruction *this)

{
  IRContext *this_00;
  bool bVar1;
  FeatureManager *pFVar2;
  
  this_00 = this->context_;
  pFVar2 = (this_00->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar2 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
    pFVar2 = (this_00->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,CapabilityShader);
  if (bVar1) {
    bVar1 = IsReadOnlyPointerShaders(this);
    return bVar1;
  }
  bVar1 = IsReadOnlyPointerKernel(this);
  return bVar1;
}

Assistant:

bool Instruction::IsReadOnlyPointer() const {
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return IsReadOnlyPointerShaders();
  else
    return IsReadOnlyPointerKernel();
}